

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuVfsLock(sqlite3_file *pFile,int eLock)

{
  int iVar1;
  rbu_file *p;
  
  if ((eLock == 4) &&
     ((*(char *)((long)&pFile[6].pMethods + 1) != '\0' ||
      ((pFile[3].pMethods != (sqlite3_io_methods *)0x0 && ((pFile[3].pMethods)->iVersion != 5))))))
  {
    return 5;
  }
  iVar1 = (**(code **)(*(long *)pFile[1].pMethods + 0x38))();
  return iVar1;
}

Assistant:

static int rbuVfsLock(sqlite3_file *pFile, int eLock){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc = SQLITE_OK;

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( eLock==SQLITE_LOCK_EXCLUSIVE 
   && (p->bNolock || (pRbu && pRbu->eStage!=RBU_STAGE_DONE))
  ){
    /* Do not allow EXCLUSIVE locks. Preventing SQLite from taking this 
    ** prevents it from checkpointing the database from sqlite3_close(). */
    rc = SQLITE_BUSY;
  }else{
    rc = p->pReal->pMethods->xLock(p->pReal, eLock);
  }

  return rc;
}